

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_hdr_meta.c
# Opt level: O1

void fill_hdr_meta_to_frame(MppFrame frame,MppCodingType in_type)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  MppFrameContentLightMetadata MVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  MppFrameColorTransferCharacteristic MVar7;
  MppFrameColorSpace MVar8;
  MppFrameColorPrimaries MVar9;
  size_t sVar10;
  MppBuffer buffer;
  void *pvVar11;
  MppFrameHdrDynamicMeta *pMVar12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined2 uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  MppFrameMasteringDisplayMetadata mastering_display;
  MppFrameMasteringDisplayMetadata local_50;
  MppMeta local_38;
  
  sVar10 = mpp_frame_get_buf_size(frame);
  uVar13 = (uint)sVar10;
  buffer = mpp_frame_get_buffer(frame);
  pvVar11 = mpp_buffer_get_ptr_with_caller(buffer,"fill_hdr_meta_to_frame");
  pMVar12 = mpp_frame_get_hdr_dynamic_meta(frame);
  mpp_frame_get_mastering_display(&local_50,frame);
  MVar4 = mpp_frame_get_content_light(frame);
  sVar10 = mpp_buffer_get_size_with_caller(buffer,"fill_hdr_meta_to_frame");
  if (buffer == (MppBuffer)0x0 || pvVar11 == (void *)0x0) {
    _mpp_log_l(2,(char *)0x0,"buf is null!\n","fill_hdr_meta_to_frame");
    return;
  }
  RVar5 = mpp_frame_get_thumbnail_en(frame);
  if (RVar5 == 2) {
    RVar5 = mpp_frame_get_width(frame);
    RVar6 = mpp_frame_get_height(frame);
    uVar13 = (RVar6 >> 1) * (RVar5 >> 1) * 3 >> 1;
  }
  uVar13 = uVar13 + 0xfff & 0xfffff000;
  uVar14 = (ulong)uVar13;
  if (pMVar12 == (MppFrameHdrDynamicMeta *)0x0) {
    iVar19 = 0;
  }
  else {
    iVar19 = pMVar12->size + 0x20;
    if (pMVar12->size == 0) {
      iVar19 = 0;
    }
  }
  if ((uint)sVar10 < iVar19 + uVar13 + 0x6c) {
    _mpp_log_l(2,(char *)0x0,"fill hdr meta overflow off %d size %d max %d\n",
               "fill_hdr_meta_to_frame",(ulong)uVar13,(ulong)(iVar19 + 0x6cU),(uint)sVar10);
    return;
  }
  local_38 = mpp_frame_get_meta(frame);
  mpp_meta_set_s32(local_38,KEY_HDR_META_OFFSET,uVar13);
  *(undefined4 *)((long)pvVar11 + uVar14) = 0x6c013e;
  *(undefined2 *)((long)pvVar11 + uVar14 + 6) = 0;
  iVar18 = -1;
  if ((int)in_type < 0x1000007) {
    if (in_type == MPP_VIDEO_CodingAVC) {
      iVar18 = 2;
    }
    else {
      bVar3 = false;
      if (in_type != MPP_VIDEO_CodingHEVC) goto LAB_0013b91a;
      iVar18 = 1;
    }
  }
  else if (in_type == MPP_VIDEO_CodingAV1) {
    iVar18 = 3;
  }
  else {
    bVar3 = false;
    if (in_type != MPP_VIDEO_CodingAVS2) goto LAB_0013b91a;
    iVar18 = 0;
  }
  bVar3 = true;
LAB_0013b91a:
  *(undefined2 *)((long)pvVar11 + uVar14 + 0xc) = 0;
  *(short *)((long)pvVar11 + uVar14 + 0xe) = (short)iVar18;
  *(RK_U32 *)((long)pvVar11 + uVar14 + 0x4c) = local_50.min_luminance;
  *(RK_U32 *)((long)pvVar11 + uVar14 + 0x50) = local_50.max_luminance;
  *(uint *)((long)pvVar11 + uVar14 + 0x34) = (uint)local_50.display_primaries[0][0];
  *(uint *)((long)pvVar11 + uVar14 + 0x38) = (uint)local_50.display_primaries[0][1];
  *(uint *)((long)pvVar11 + uVar14 + 0x3c) = (uint)local_50.display_primaries[1][0];
  *(uint *)((long)pvVar11 + uVar14 + 0x40) = (uint)local_50.display_primaries[1][1];
  *(uint *)((long)pvVar11 + uVar14 + 0x2c) = (uint)local_50.display_primaries[2][0];
  *(uint *)((long)pvVar11 + uVar14 + 0x30) = (uint)local_50.display_primaries[2][1];
  *(uint *)((long)pvVar11 + uVar14 + 0x44) = (uint)local_50.white_point[0];
  *(uint *)((long)pvVar11 + uVar14 + 0x48) = (uint)local_50.white_point[1];
  MVar7 = mpp_frame_get_color_trc(frame);
  *(MppFrameColorTransferCharacteristic *)((long)pvVar11 + uVar14 + 0x28) = MVar7;
  MVar8 = mpp_frame_get_colorspace(frame);
  *(MppFrameColorSpace *)((long)pvVar11 + uVar14 + 0x20) = MVar8;
  MVar9 = mpp_frame_get_color_primaries(frame);
  *(MppFrameColorPrimaries *)((long)pvVar11 + uVar14 + 0x24) = MVar9;
  *(uint *)((long)pvVar11 + uVar14 + 0x54) = (uint)MVar4 & 0xffff;
  *(uint *)((long)pvVar11 + uVar14 + 0x58) = (uint)MVar4 >> 0x10;
  if (bVar3) {
    iVar1 = *(int *)((long)pvVar11 + uVar14 + 0x28);
    uVar15 = 2;
    if (iVar1 != *(int *)(&DAT_00152d7c + (long)iVar18 * 4)) {
      uVar15 = (ushort)(iVar1 == *(int *)(&DAT_00152d6c + (long)iVar18 * 4));
    }
  }
  else {
    uVar15 = 0;
  }
  uVar16 = 1;
  if ((pMVar12 != (MppFrameHdrDynamicMeta *)0x0) && (uVar2 = pMVar12->size, (ulong)uVar2 != 0)) {
    uVar17 = (ulong)(uVar13 + *(ushort *)((long)pvVar11 + uVar14 + 2));
    *(undefined2 *)((long)pvVar11 + uVar17) = 0x13e;
    *(short *)((long)pvVar11 + uVar17 + 2) = (short)iVar19;
    *(undefined2 *)((long)pvVar11 + uVar17 + 6) = 1;
    *(undefined2 *)((long)pvVar11 + uVar17 + 0xc) = 1;
    *(short *)((long)pvVar11 + uVar17 + 0xe) = (short)iVar18;
    uVar15 = (ushort)pMVar12->hdr_fmt;
    memcpy((void *)((long)pvVar11 + uVar17 + 0x20),pMVar12 + 1,(ulong)uVar2);
    *(undefined2 *)((long)pvVar11 + uVar17 + 4) = 2;
    *(ushort *)((long)pvVar11 + uVar17 + 10) = uVar15;
    uVar16 = 2;
  }
  mpp_meta_set_s32(local_38,KEY_HDR_META_SIZE,iVar19 + 0x6cU);
  *(undefined2 *)((long)pvVar11 + uVar14 + 4) = uVar16;
  *(ushort *)((long)pvVar11 + uVar14 + 10) = uVar15;
  return;
}

Assistant:

void fill_hdr_meta_to_frame(MppFrame frame, MppCodingType in_type)
{
    RK_U32 off = hdr_get_offset_from_frame(frame);
    MppBuffer buf = mpp_frame_get_buffer(frame);
    void *ptr = mpp_buffer_get_ptr(buf);
    MppFrameHdrDynamicMeta *dynamic_meta = mpp_frame_get_hdr_dynamic_meta(frame);
    MppFrameMasteringDisplayMetadata mastering_display = mpp_frame_get_mastering_display(frame);
    MppFrameContentLightMetadata content_light = mpp_frame_get_content_light(frame);
    RkMetaHdrHeader *hdr_static_meta_header;
    RkMetaHdrHeader *hdr_dynamic_meta_header;
    RK_U32 msg_idx = 0;
    RK_U16 hdr_format = HDR_NONE;
    MppMeta meta = NULL;
    RK_U32 max_size = mpp_buffer_get_size(buf);
    RK_U32 static_size, dynamic_size = 0, total_size = 0;
    HdrCodecType codec_type = HDR_CODEC_UNSPECIFIED;

    if (!ptr || !buf) {
        mpp_err_f("buf is null!\n");
        return;
    }

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_ONLY) {
        // only for 8K thumbnail downscale to 4K 8bit mode
        RK_U32 downscale_width = mpp_frame_get_width(frame) / 2;
        RK_U32 downscale_height = mpp_frame_get_height(frame) / 2;

        off = downscale_width * downscale_height * 3 / 2;
    }
    off = MPP_ALIGN(off, SZ_4K);

    static_size = sizeof(RkMetaHdrHeader) + sizeof(HdrStaticMeta);
    if (dynamic_meta && dynamic_meta->size)
        dynamic_size = sizeof(RkMetaHdrHeader) + dynamic_meta->size;

    total_size = static_size + dynamic_size;

    if ((off + total_size) > max_size) {
        mpp_err_f("fill hdr meta overflow off %d size %d max %d\n",
                  off, total_size, max_size);
        return;
    }
    meta = mpp_frame_get_meta(frame);
    mpp_meta_set_s32(meta, KEY_HDR_META_OFFSET, off);
    /* 1. fill hdr static meta date */
    hdr_static_meta_header = (RkMetaHdrHeader*)(ptr + off);
    /* For transmission */
    hdr_static_meta_header->magic = HDR_META_MAGIC;
    hdr_static_meta_header->size = static_size;
    hdr_static_meta_header->message_index = msg_idx++;

    switch (in_type) {
    case MPP_VIDEO_CodingAVS2 : {
        codec_type = HDR_AVS2;
    } break;
    case MPP_VIDEO_CodingHEVC : {
        codec_type = HDR_HEVC;
    } break;
    case MPP_VIDEO_CodingAVC : {
        codec_type = HDR_H264;
    } break;
    case MPP_VIDEO_CodingAV1 : {
        codec_type = HDR_AV1;
    } break;
    default : break;
    }

    /* For payload identification */
    hdr_static_meta_header->hdr_payload_type = STATIC;
    hdr_static_meta_header->video_format = codec_type;
    {
        HdrStaticMeta *static_meta = (HdrStaticMeta*)hdr_static_meta_header->payload;

        static_meta->min_luminance = mastering_display.min_luminance;
        static_meta->max_luminance = mastering_display.max_luminance;
        static_meta->green_x = mastering_display.display_primaries[0][0];
        static_meta->green_y = mastering_display.display_primaries[0][1];
        static_meta->blue_x = mastering_display.display_primaries[1][0];
        static_meta->blue_y = mastering_display.display_primaries[1][1];
        static_meta->red_x = mastering_display.display_primaries[2][0];
        static_meta->red_y = mastering_display.display_primaries[2][1];
        static_meta->white_point_x = mastering_display.white_point[0];
        static_meta->white_point_y = mastering_display.white_point[1];
        static_meta->color_trc = mpp_frame_get_color_trc(frame);
        static_meta->color_space = mpp_frame_get_colorspace(frame);
        static_meta->color_primaries = mpp_frame_get_color_primaries(frame);
        static_meta->max_cll = content_light.MaxCLL;
        static_meta->max_fall = content_light.MaxFALL;
        /*
         * hlg:
         *  hevc trc = 18
         *  avs trc = 14
         * hdr10:
         *  hevc/h264 trc = 16
         *  avs trc = 12
         */
        switch (codec_type) {
        case HDR_AV1 :
        case HDR_HEVC :
        case HDR_H264 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_ARIB_STD_B67)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_SMPTEST2084)
                hdr_format = HDR10;
        } break;
        case HDR_AVS2 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_BT2020_10)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_BT1361_ECG)
                hdr_format = HDR10;
        } break;
        default : {
        } break;
        }
    }
    off += hdr_static_meta_header->size;

    /* 2. fill hdr dynamic meta date */
    if (dynamic_meta && dynamic_meta->size) {
        hdr_dynamic_meta_header = (RkMetaHdrHeader*)(ptr + off);

        /* For transmission */
        hdr_dynamic_meta_header->magic = HDR_META_MAGIC;
        hdr_dynamic_meta_header->size = dynamic_size;
        hdr_dynamic_meta_header->message_index = msg_idx++;

        /* For payload identification */
        hdr_dynamic_meta_header->hdr_payload_type = DYNAMIC;
        hdr_dynamic_meta_header->video_format = codec_type;
        hdr_format = dynamic_meta->hdr_fmt;

        memcpy(hdr_dynamic_meta_header->payload, dynamic_meta->data, dynamic_meta->size);
        hdr_dynamic_meta_header->message_total = msg_idx;
        hdr_dynamic_meta_header->hdr_format = hdr_format;
    }

    mpp_meta_set_s32(meta, KEY_HDR_META_SIZE, total_size);
    hdr_static_meta_header->message_total = msg_idx;
    hdr_static_meta_header->hdr_format = hdr_format;
}